

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * Cudd_bddSqueeze(DdManager *dd,DdNode *l,DdNode *u)

{
  int iVar1;
  int sizeU;
  int sizeL;
  int sizeRes;
  DdNode *res;
  DdNode *u_local;
  DdNode *l_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    _sizeL = (DdManager *)cuddBddSqueeze(dd,l,u);
  } while (dd->reordered == 1);
  if (_sizeL == (DdManager *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    sizeU = Cudd_DagSize((DdNode *)_sizeL);
    iVar1 = Cudd_DagSize(u);
    if (iVar1 <= sizeU) {
      *(int *)(((ulong)_sizeL & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)_sizeL & 0xfffffffffffffffe) + 4) + 1;
      Cudd_IterDerefBdd(dd,(DdNode *)_sizeL);
      sizeU = iVar1;
      _sizeL = (DdManager *)u;
    }
    iVar1 = Cudd_DagSize(l);
    if (iVar1 <= sizeU) {
      *(int *)(((ulong)_sizeL & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)_sizeL & 0xfffffffffffffffe) + 4) + 1;
      Cudd_IterDerefBdd(dd,&_sizeL->sentinel);
      _sizeL = (DdManager *)l;
    }
    dd_local = _sizeL;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddSqueeze(
  DdManager * dd /* manager */,
  DdNode * l /* lower bound */,
  DdNode * u /* upper bound */)
{
    DdNode *res;
    int sizeRes, sizeL, sizeU;

    do {
        dd->reordered = 0;
        res = cuddBddSqueeze(dd,l,u);
    } while (dd->reordered == 1);
    if (res == NULL) return(NULL);
    /* We now compare the result with the bounds and return the smallest.
    ** We first compare to u, so that in case l == 0 and u == 1, we return
    ** 0 as in other minimization algorithms. */
    sizeRes = Cudd_DagSize(res);
    sizeU = Cudd_DagSize(u);
    if (sizeU <= sizeRes) {
        cuddRef(res);
        Cudd_IterDerefBdd(dd,res);
        res = u;
        sizeRes = sizeU;
    }
    sizeL = Cudd_DagSize(l);
    if (sizeL <= sizeRes) {
        cuddRef(res);
        Cudd_IterDerefBdd(dd,res);
        res = l;
        sizeRes = sizeL;
    }
    return(res);

}